

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::ByteRange(Compiler *this,int lo,int hi,bool foldcase)

{
  long lVar1;
  Frag FVar2;
  ulong uVar3;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  uint uStack_44;
  
  local_50 = AllocInst(this,1);
  if ((int)local_50 < 0) {
    local_50 = 0;
    lVar1 = 0;
  }
  else {
    uVar3 = (ulong)local_50;
    Prog::Inst::InitByteRange
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar3,lo,hi,
               (uint)foldcase,0);
    lVar1 = (uVar3 << 0x21) + uVar3 * 2;
  }
  uStack_44 = uStack_44 & 0xffffff00;
  uStack_48 = (undefined4)((ulong)lVar1 >> 0x20);
  uStack_4c = (undefined4)lVar1;
  FVar2.end.head = uStack_4c;
  FVar2.begin = local_50;
  FVar2.end.tail = uStack_48;
  FVar2._12_4_ = uStack_44;
  return FVar2;
}

Assistant:

Frag Compiler::ByteRange(int lo, int hi, bool foldcase) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitByteRange(lo, hi, foldcase, 0);
  return Frag(id, PatchList::Mk(id << 1), false);
}